

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_sjasm.cpp
# Opt level: O2

bool lua_zx_trdimage_add_file(char *trd,char *file,int start,int length,int autostart,bool replace)

{
  bool bVar1;
  int to_remove;
  char *trd_local;
  path local_58;
  
  trd_local = trd;
  to_remove = addLuaSourcePositions();
  if (file == (char *)0x0 || trd == (char *)0x0) {
    bVar1 = false;
  }
  else {
    std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
              (&local_58,&trd_local,auto_format);
    bVar1 = TRD_AddFile(&local_58,file,start,length,autostart,replace,false,-1);
    std::filesystem::__cxx11::path::~path(&local_58);
  }
  removeLuaSourcePositions(to_remove);
  return bVar1;
}

Assistant:

bool lua_zx_trdimage_add_file(const char* trd, const char* file, int start, int length, int autostart = -1, bool replace = false) {
	int positionsAdded = addLuaSourcePositions();	// add known script positions to sourcePosStack vector
	bool result = nullptr != trd && nullptr != file && TRD_AddFile(trd, file, start, length, autostart, replace, false);
	removeLuaSourcePositions(positionsAdded);
	return result;
}